

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O0

void gprefs_from_str(char *str,keyvalwhere *mapping,int nvals,Conf *conf,int primary)

{
  char *key;
  int iVar1;
  int iVar2;
  uint uVar3;
  char *ptr;
  bool bVar4;
  int local_74;
  int local_70;
  unsigned_long seen;
  int pos;
  int v;
  int n;
  int j;
  int i;
  char *q;
  char *p;
  char *commalist;
  int primary_local;
  Conf *conf_local;
  int nvals_local;
  keyvalwhere *mapping_local;
  char *str_local;
  
  ptr = dupstr(str);
  uVar3 = 0;
  pos = 0;
  q = ptr;
  while( true ) {
    while( true ) {
      key = q;
      bVar4 = false;
      if (*q != '\0') {
        bVar4 = *q == ',';
      }
      if (!bVar4) break;
      q = q + 1;
    }
    if (*q == '\0') break;
    while( true ) {
      bVar4 = false;
      if (*q != '\0') {
        bVar4 = *q != ',';
      }
      if (!bVar4) break;
      q = q + 1;
    }
    if (*q != '\0') {
      *q = '\0';
      q = q + 1;
    }
    iVar1 = key2val(mapping,nvals,key);
    if ((iVar1 != -1) && ((uVar3 & 1 << ((byte)iVar1 & 0x1f)) == 0)) {
      uVar3 = 1 << ((byte)iVar1 & 0x1f) | uVar3;
      conf_set_int_int(conf,primary,pos,iVar1);
      pos = pos + 1;
    }
  }
  safefree(ptr);
  do {
    if (nvals <= pos) {
      return;
    }
    for (n = 0; n < nvals; n = n + 1) {
      if (mapping[n].v < 0) {
        __assert_fail("mapping[i].v >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c"
                      ,0x182,
                      "void gprefs_from_str(const char *, const struct keyvalwhere *, int, Conf *, int)"
                     );
      }
      if (0x1f < mapping[n].v) {
        __assert_fail("mapping[i].v < 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c"
                      ,0x183,
                      "void gprefs_from_str(const char *, const struct keyvalwhere *, int, Conf *, int)"
                     );
      }
      if (((uVar3 & 1 << ((byte)mapping[n].v & 0x1f)) == 0) &&
         ((mapping[n].vrel == -1 || ((uVar3 & 1 << ((byte)mapping[n].vrel & 0x1f)) != 0)))) {
        iVar1 = pos;
        if (mapping[n].vrel == -1) {
          if (mapping[n].where < 0) {
            local_70 = pos;
          }
          else {
            local_70 = 0;
          }
          seen._4_4_ = local_70;
        }
        else {
          v = 0;
          while ((v < pos && (iVar2 = conf_get_int_int(conf,primary,v), iVar2 != mapping[n].vrel)))
          {
            v = v + 1;
          }
          if (pos <= v) {
            __assert_fail("j < n",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c"
                          ,0x197,
                          "void gprefs_from_str(const char *, const struct keyvalwhere *, int, Conf *, int)"
                         );
          }
          if (mapping[n].where < 0) {
            local_74 = v;
          }
          else {
            local_74 = v + 1;
          }
          seen._4_4_ = local_74;
        }
        while (v = iVar1 + -1, seen._4_4_ <= v) {
          iVar2 = conf_get_int_int(conf,primary,v);
          conf_set_int_int(conf,primary,iVar1,iVar2);
          iVar1 = v;
        }
        conf_set_int_int(conf,primary,seen._4_4_,mapping[n].v);
        uVar3 = 1 << ((byte)mapping[n].v & 0x1f) | uVar3;
        pos = pos + 1;
      }
    }
  } while( true );
}

Assistant:

static void gprefs_from_str(const char *str,
                            const struct keyvalwhere *mapping, int nvals,
                            Conf *conf, int primary)
{
    char *commalist = dupstr(str);
    char *p, *q;
    int i, j, n, v, pos;
    unsigned long seen = 0;            /* bitmap for weeding dups etc */

    /*
     * Go through that list and convert it into values.
     */
    n = 0;
    p = commalist;
    while (1) {
        while (*p && *p == ',') p++;
        if (!*p)
            break;                     /* no more words */

        q = p;
        while (*p && *p != ',') p++;
        if (*p) *p++ = '\0';

        v = key2val(mapping, nvals, q);
        if (v != -1 && !(seen & (1 << v))) {
            seen |= (1 << v);
            conf_set_int_int(conf, primary, n, v);
            n++;
        }
    }

    sfree(commalist);

    /*
     * Now go through 'mapping' and add values that weren't mentioned
     * in the list we fetched. We may have to loop over it multiple
     * times so that we add values before other values whose default
     * positions depend on them.
     */
    while (n < nvals) {
        for (i = 0; i < nvals; i++) {
            assert(mapping[i].v >= 0);
            assert(mapping[i].v < 32);

            if (!(seen & (1 << mapping[i].v))) {
                /*
                 * This element needs adding. But can we add it yet?
                 */
                if (mapping[i].vrel != -1 && !(seen & (1 << mapping[i].vrel)))
                    continue;          /* nope */

                /*
                 * OK, we can work out where to add this element, so
                 * do so.
                 */
                if (mapping[i].vrel == -1) {
                    pos = (mapping[i].where < 0 ? n : 0);
                } else {
                    for (j = 0; j < n; j++)
                        if (conf_get_int_int(conf, primary, j) ==
                            mapping[i].vrel)
                            break;
                    assert(j < n);     /* implied by (seen & (1<<vrel)) */
                    pos = (mapping[i].where < 0 ? j : j+1);
                }

                /*
                 * And add it.
                 */
                for (j = n-1; j >= pos; j--)
                    conf_set_int_int(conf, primary, j+1,
                                     conf_get_int_int(conf, primary, j));
                conf_set_int_int(conf, primary, pos, mapping[i].v);
                seen |= (1 << mapping[i].v);
                n++;
            }
        }
    }
}